

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  
  iVar2 = 0;
  uVar4 = 0;
  while (gl_unit_tests[uVar4].name != (char *)0x0) {
    iVar1 = (*gl_unit_tests[uVar4].fun_unit_test)();
    pcVar3 = "PASS";
    if (iVar1 != 1) {
      pcVar3 = "FAIL";
    }
    printf("[%s] %s\n",pcVar3,gl_unit_tests[uVar4].name);
    iVar2 = iVar2 + (uint)(iVar1 != 1);
    uVar4 = uVar4 + 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
    (void) argc;  // Unused parameter
    (void) argv;  // Unused parameter

    unsigned int idx           = 0;
    int          success_count = 0;
    int          error_count   = 0;

    while (gl_unit_tests[idx].name != NULL) {
        int ret = gl_unit_tests[idx].fun_unit_test();
        printf("[%s] %s\n", ret == 1 ? "PASS" : "FAIL", gl_unit_tests[idx].name);

        if (ret == 1) {
            success_count += 1;
        } else {
            error_count += 1;
        }

        idx += 1;
    }

    return (error_count);
}